

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_types.h
# Opt level: O2

Literal Clasp::DecisionHeuristic::selectLiteral(Solver *s,Var v,int signScore)

{
  byte bVar1;
  Literal LVar2;
  uint32 uVar3;
  
  if (v < (s->assign_).pref_.ebo_.size) {
    bVar1 = (s->assign_).pref_.ebo_.buf[v].rep;
  }
  else {
    bVar1 = 0;
  }
  if ((signScore == 0) || ((bVar1 & 0x3f) != 0)) {
    if (bVar1 == 0) {
      LVar2 = Solver::defaultLit(s,v);
      return (Literal)LVar2.rep_;
    }
    uVar3 = v * 4 + (uint)((-bVar1 & bVar1 & 0xaa) != 0) * 2;
  }
  else {
    uVar3 = v << 2 | (uint)signScore >> 0x1e & 0xfffffffe;
  }
  return (Literal)uVar3;
}

Assistant:

const ValueSet    pref(Var v)  const { return v < pref_.size() ? pref_[v] : ValueSet(); }